

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O1

TimingControl *
slang::ast::CycleDelayControl::fromSyntax
          (Compilation *compilation,DelaySyntax *syntax,ASTContext *context)

{
  ExpressionSyntax *pEVar1;
  Scope *scope;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  SourceLocation SVar4;
  Symbol *pSVar5;
  char *func;
  SourceRange sourceRange;
  SourceRange local_38;
  
  pEVar1 = (syntax->delayValue).ptr;
  if (pEVar1 == (ExpressionSyntax *)0x0) {
    func = 
    "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
    ;
LAB_002863f9:
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,func);
  }
  iVar3 = Expression::bind((int)pEVar1,(sockaddr *)context,0);
  local_38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  SVar4 = (SourceLocation)
          BumpAllocator::
          emplace<slang::ast::CycleDelayControl,slang::ast::Expression_const&,slang::SourceRange>
                    (&compilation->super_BumpAllocator,(Expression *)CONCAT44(extraout_var,iVar3),
                     &local_38);
  bVar2 = ASTContext::requireIntegral(context,(Expression *)CONCAT44(extraout_var,iVar3));
  if (bVar2) {
    if (((context->flags).m_bits & 0x400000) == 0) {
      scope = (context->scope).ptr;
      if (scope == (Scope *)0x0) {
        func = 
        "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
        goto LAB_002863f9;
      }
      pSVar5 = Compilation::getDefaultClocking(compilation,scope);
      if (pSVar5 == (Symbol *)0x0) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        ASTContext::addDiag(context,(DiagCode)0x280008,sourceRange);
      }
    }
  }
  else {
    local_38.startLoc = SVar4;
    SVar4 = (SourceLocation)
            BumpAllocator::
            emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                      (&compilation->super_BumpAllocator,(TimingControl **)&local_38);
  }
  return (TimingControl *)SVar4;
}

Assistant:

TimingControl& CycleDelayControl::fromSyntax(Compilation& compilation, const DelaySyntax& syntax,
                                             const ASTContext& context) {
    auto& expr = Expression::bind(*syntax.delayValue, context);
    auto result = compilation.emplace<CycleDelayControl>(expr, syntax.sourceRange());

    if (!context.requireIntegral(expr))
        return badCtrl(compilation, result);

    if (!context.flags.has(ASTFlags::LValue) && !compilation.getDefaultClocking(*context.scope))
        context.addDiag(diag::NoDefaultClocking, syntax.sourceRange());

    return *result;
}